

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel_sort.h
# Opt level: O3

void __thiscall
embree::ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
::sort(ParallelRadixSort<embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue,_unsigned_int>
       *this,size_t blockSize)

{
  KeyValue *__last;
  uint uVar1;
  KeyValue KVar2;
  long lVar3;
  KeyValue *pKVar4;
  int iVar5;
  ulong uVar6;
  ulong uVar7;
  KeyValue *pKVar8;
  KeyValue *pKVar9;
  KeyValue *__i;
  KeyValue *pKVar10;
  size_t numTasks;
  value_type __val_1;
  size_t __n;
  KeyValue *pKVar11;
  value_type __val;
  
  uVar7 = this->N;
  if (blockSize < uVar7) {
    uVar6 = ((blockSize + uVar7) - 1) / blockSize;
    iVar5 = tbb::detail::r1::max_concurrency((task_arena_base *)0x0);
    uVar7 = (long)iVar5;
    if (uVar6 < (ulong)(long)iVar5) {
      uVar7 = uVar6;
    }
    numTasks = 0x40;
    if (uVar7 < 0x40) {
      numTasks = uVar7;
    }
    tbbRadixSort(this,numTasks);
    return;
  }
  if (uVar7 != 0) {
    pKVar10 = this->src;
    __last = pKVar10 + uVar7;
    lVar3 = 0x3f;
    if (uVar7 != 0) {
      for (; uVar7 >> lVar3 == 0; lVar3 = lVar3 + -1) {
      }
    }
    std::
    __introsort_loop<embree::parallel_map<unsigned_int,unsigned_int>::KeyValue*,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const&,embree::parallel_map<unsigned_int,unsigned_int>::KeyValue_const&)>>
              (pKVar10,__last,(ulong)(((uint)lVar3 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue_&,_const_embree::parallel_map<unsigned_int,_unsigned_int>::KeyValue_&)>
                )0x15ee42);
    if ((long)uVar7 < 0x11) {
      if (uVar7 != 1) {
        pKVar9 = pKVar10 + 1;
        pKVar11 = pKVar10;
        do {
          pKVar8 = pKVar9;
          KVar2 = pKVar11[1];
          if (pKVar11[1].key < pKVar10->key) {
            memmove((void *)((long)pKVar11 + (0x10 - ((long)pKVar8 - (long)pKVar10))),pKVar10,
                    (long)pKVar8 - (long)pKVar10);
            pKVar9 = pKVar10;
          }
          else {
            uVar1 = pKVar11->key;
            pKVar9 = pKVar8;
            while (KVar2.key < uVar1) {
              *pKVar9 = pKVar9[-1];
              uVar1 = pKVar9[-2].key;
              pKVar9 = pKVar9 + -1;
            }
          }
          *pKVar9 = KVar2;
          pKVar9 = pKVar8 + 1;
          pKVar11 = pKVar8;
        } while (pKVar8 + 1 != __last);
      }
    }
    else {
      __n = 8;
      pKVar9 = pKVar10;
      pKVar11 = pKVar10 + 1;
      do {
        pKVar8 = (KeyValue *)((long)&pKVar10->key + __n);
        KVar2 = *(KeyValue *)((long)&pKVar10->key + __n);
        if (*(uint *)((long)&pKVar10->key + __n) < pKVar10->key) {
          memmove(pKVar10 + 1,pKVar10,__n);
          pKVar9 = pKVar10;
        }
        else {
          uVar1 = pKVar9->key;
          pKVar9 = pKVar8;
          pKVar4 = pKVar11;
          while (KVar2.key < uVar1) {
            pKVar9 = pKVar4 + -1;
            *pKVar4 = pKVar4[-1];
            uVar1 = pKVar4[-2].key;
            pKVar4 = pKVar9;
          }
        }
        *pKVar9 = KVar2;
        __n = __n + 8;
        pKVar11 = pKVar11 + 1;
        pKVar9 = pKVar8;
      } while (__n != 0x80);
      pKVar10 = pKVar10 + 0x10;
      do {
        KVar2 = *pKVar10;
        uVar1 = pKVar10[-1].key;
        pKVar9 = pKVar10;
        while (KVar2.key < uVar1) {
          *pKVar9 = pKVar9[-1];
          uVar1 = pKVar9[-2].key;
          pKVar9 = pKVar9 + -1;
        }
        *pKVar9 = KVar2;
        pKVar10 = pKVar10 + 1;
      } while (pKVar10 != __last);
    }
  }
  return;
}

Assistant:

void sort(const size_t blockSize)
    {
      assert(blockSize > 0);
      
      /* perform single threaded sort for small N */
      if (N<=blockSize) // handles also special case of 0!
      {	  
        /* do inplace sort inside destination array */
        std::sort(src,src+N,compare<Ty>);
      }
      
      /* perform parallel sort for large N */
      else 
      {
        const size_t numThreads = min((N+blockSize-1)/blockSize,TaskScheduler::threadCount(),size_t(MAX_TASKS));
        tbbRadixSort(numThreads);
      }
    }